

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thetaneuron.cxx
# Opt level: O0

void __thiscall ThetaNeuron::ThetaNeuron(ThetaNeuron *this,Time *time,string *name,string *type)

{
  Time *pTVar1;
  string *time_00;
  ThetaMembrane *this_00;
  StochasticVariable *integrator;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  string local_68;
  string local_48;
  string *local_28;
  string *type_local;
  string *name_local;
  Time *time_local;
  ThetaNeuron *this_local;
  
  local_28 = type;
  type_local = name;
  name_local = (string *)time;
  time_local = (Time *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  std::__cxx11::string::string((string *)&local_68,(string *)local_28);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  time_00 = name_local;
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron =
       (_func_int **)&PTR___cxa_pure_virtual_00191230;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ThetaNeuron_00191268;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__ThetaNeuron_00191300;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__ThetaNeuron_00191348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Differential Equation",&local_c1);
  DifferentialEquation::DifferentialEquation
            (&this->thetaMembrane,(Time *)time_00,3.1415926535,0.0,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.super_Physical.physicalDescription,"voltage");
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.stochDescription,"theta neuron");
  this_00 = (ThetaMembrane *)operator_new(0x148);
  local_112 = 1;
  pTVar1 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
           super_StochasticProcess.super_TimeDependent.xTime;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Theta Membrane",&local_111);
  ThetaMembrane::ThetaMembrane(this_00,pTVar1,&local_e8,&local_110);
  local_112 = 0;
  integrator = (StochasticVariable *)operator_new(0x148);
  pTVar1 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
           super_StochasticProcess.super_TimeDependent.xTime;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"t",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Time Process",&local_161)
  ;
  TimeProcess::TimeProcess((TimeProcess *)integrator,pTVar1,&local_138,&local_160);
  DifferentialEquation::addTerm(&this->thetaMembrane,(StochasticFunction *)this_00,integrator);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  return;
}

Assistant:

ThetaNeuron::ThetaNeuron(Time *time, const string& name, const string& type)
	: SpikingNeuron(time, name, type), thetaMembrane(time, 3.1415926535, 0.0)
{
	physicalDescription = "voltage";
	stochDescription = "theta neuron";
	thetaMembrane.addTerm( new ThetaMembrane(xTime), new TimeProcess(xTime) );
}